

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

void __thiscall
glslang::TVariable::TVariable(TVariable *this,TString *name,TString *mangledName,TType *t,bool uT)

{
  (this->super_TSymbol).name = name;
  (this->super_TSymbol).mangledName = mangledName;
  (this->super_TSymbol).uniqueId = 0;
  (this->super_TSymbol).extensions = (TExtensionList *)0x0;
  (this->super_TSymbol).writable = true;
  (this->super_TSymbol)._vptr_TSymbol = (_func_int **)&PTR_clone_00af61e0;
  TType::TType(&this->type,EbtVoid,EvqTemporary,1,0,0,false);
  this->userType = uT;
  (this->constArray)._vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_00af64b8;
  (this->constArray).unionArray = (TConstUnionVector *)0x0;
  this->constSubtree = (TIntermTyped *)0x0;
  this->memberExtensions = (TVector<glslang::TVector<const_char_*>_> *)0x0;
  this->anonId = -1;
  TType::shallowCopy(&this->type,t);
  return;
}

Assistant:

TVariable(const TString *name, const TString *mangledName, const TType& t, bool uT = false )
        : TSymbol(name, mangledName),
          userType(uT),
          constSubtree(nullptr),
          memberExtensions(nullptr),
          anonId(-1)
        { type.shallowCopy(t); }